

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

int __thiscall ncnn::Reduction::load_param(Reduction *this,ParamDict *pd)

{
  int iVar1;
  Mat *in_RSI;
  long in_RDI;
  float fVar2;
  Mat *m;
  Mat *this_00;
  Mat *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff74;
  ParamDict *in_stack_ffffffffffffff78;
  
  iVar1 = ParamDict::get((ParamDict *)in_RSI,0,0);
  *(int *)(in_RDI + 0x80) = iVar1;
  iVar1 = ParamDict::get((ParamDict *)in_RSI,1,1);
  *(int *)(in_RDI + 0x84) = iVar1;
  fVar2 = ParamDict::get((ParamDict *)in_RSI,2,1.0);
  *(float *)(in_RDI + 0x88) = fVar2;
  this_00 = (Mat *)&stack0xffffffffffffff70;
  m = in_RSI;
  Mat::Mat(this_00);
  ParamDict::get(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  Mat::operator=(this_00,m);
  Mat::~Mat((Mat *)0x1711ae);
  Mat::~Mat((Mat *)0x1711b8);
  iVar1 = ParamDict::get((ParamDict *)in_RSI,4,0);
  *(int *)(in_RDI + 0xd0) = iVar1;
  return 0;
}

Assistant:

int Reduction::load_param(const ParamDict& pd)
{
    operation = pd.get(0, 0);
    reduce_all = pd.get(1, 1);
    coeff = pd.get(2, 1.f);
    axes = pd.get(3, Mat());
    keepdims = pd.get(4, 0);

    return 0;
}